

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElabVisitors.h
# Opt level: O3

void __thiscall slang::ast::DiagnosticVisitor::finalize(DiagnosticVisitor *this)

{
  group_type_pointer pgVar1;
  undefined4 uVar2;
  size_t sVar3;
  pointer pEVar4;
  Symbol *this_00;
  InstanceSymbol *instance;
  size_type sVar5;
  GenericClassDefSymbol *this_01;
  pointer ppAVar6;
  uint uVar7;
  undefined1 auVar8 [16];
  ushort uVar9;
  pointer ppIVar10;
  undefined8 uVar11;
  StackAllocator<const_slang::ast::Type_*,_64UL,_16UL> SVar12;
  bool bVar13;
  ulong pos0;
  Type *pTVar14;
  char_pointer puVar15;
  char_pointer puVar16;
  value_type *elements;
  table_element_pointer ppVar17;
  uint uVar18;
  not_null<const_slang::ast::Symbol_*> *sym;
  long lVar19;
  Compilation *pCVar20;
  ulong hash;
  ulong uVar21;
  ulong uVar22;
  pointer ppGVar23;
  pointer ppIVar24;
  char_pointer puVar25;
  long lVar26;
  uchar uVar27;
  uchar uVar30;
  uchar uVar31;
  byte bVar32;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar33 [16];
  iterator iVar34;
  SmallSet<const_slang::ast::Type_*,_8UL,_slang::detail::hashing::StackAllocator<const_slang::ast::Type_*,_64UL,_16UL>_>
  visitedSpecs;
  _Iterator<false> __begin4;
  SmallVector<const_slang::ast::Type_*,_5UL> toVisit;
  locator res;
  Type *local_158;
  pointer local_150;
  undefined1 local_148 [16];
  pointer local_138;
  Storage *local_108;
  Storage *local_100;
  undefined1 local_f8 [24];
  value_type_pointer ppTStack_e0;
  undefined1 local_d8 [16];
  _Iterator<false> local_c8;
  StackAllocator<const_slang::ast::Type_*,_64UL,_16UL> local_b0;
  long local_a8;
  undefined8 local_a0;
  undefined1 local_98 [40];
  locator local_70;
  uchar local_58;
  uchar uStack_57;
  uchar uStack_56;
  byte bStack_55;
  uchar uStack_54;
  uchar uStack_53;
  uchar uStack_52;
  byte bStack_51;
  uchar uStack_50;
  uchar uStack_4f;
  uchar uStack_4e;
  byte bStack_4d;
  uchar uStack_4c;
  uchar uStack_4b;
  uchar uStack_4a;
  byte bStack_49;
  _Parent local_40;
  
  pCVar20 = this->compilation;
  if ((pCVar20->hierarchicalAssignments).
      super__Vector_base<const_slang::ast::HierarchicalReference_*,_std::allocator<const_slang::ast::HierarchicalReference_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pCVar20->hierarchicalAssignments).
      super__Vector_base<const_slang::ast::HierarchicalReference_*,_std::allocator<const_slang::ast::HierarchicalReference_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    this->disableCache = true;
    std::
    vector<const_slang::ast::HierarchicalReference_*,_std::allocator<const_slang::ast::HierarchicalReference_*>_>
    ::vector((vector<const_slang::ast::HierarchicalReference_*,_std::allocator<const_slang::ast::HierarchicalReference_*>_>
              *)local_148,&pCVar20->hierarchicalAssignments);
    uVar11 = local_148._8_8_;
    for (ppIVar24 = (pointer)local_148._0_8_; ppIVar24 != (pointer)uVar11; ppIVar24 = ppIVar24 + 1)
    {
      sVar3 = ((__extent_storage<18446744073709551615UL> *)
              &((*ppIVar24)->super_InstanceSymbolBase).super_Symbol.location)->_M_extent_value;
      if (sVar3 != 0) {
        pEVar4 = ((span<const_slang::ast::HierarchicalReference::Element,_18446744073709551615UL> *)
                 &((*ppIVar24)->super_InstanceSymbolBase).super_Symbol.name._M_str)->_M_ptr;
        lVar19 = 0;
        do {
          this_00 = *(Symbol **)((long)&(pEVar4->symbol).ptr + lVar19);
          if ((this_00->kind == Instance) && (this_00[1].originatingSyntax != (SyntaxNode *)0x0)) {
            Symbol::visit<slang::ast::DiagnosticVisitor&>(this_00,this);
          }
          lVar19 = lVar19 + 0x20;
        } while (sVar3 << 5 != lVar19);
      }
    }
    if ((pointer)local_148._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_148._0_8_,(long)local_138 - local_148._0_8_);
    }
    pCVar20 = this->compilation;
  }
  if ((pCVar20->virtualInterfaceInstances).
      super__Vector_base<const_slang::ast::InstanceSymbol_*,_std::allocator<const_slang::ast::InstanceSymbol_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pCVar20->virtualInterfaceInstances).
      super__Vector_base<const_slang::ast::InstanceSymbol_*,_std::allocator<const_slang::ast::InstanceSymbol_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      std::
      vector<const_slang::ast::InstanceSymbol_*,_std::allocator<const_slang::ast::InstanceSymbol_*>_>
      ::vector((vector<const_slang::ast::InstanceSymbol_*,_std::allocator<const_slang::ast::InstanceSymbol_*>_>
                *)local_148,&pCVar20->virtualInterfaceInstances);
      uVar11 = local_148._8_8_;
      pCVar20 = this->compilation;
      ppIVar24 = (pCVar20->virtualInterfaceInstances).
                 super__Vector_base<const_slang::ast::InstanceSymbol_*,_std::allocator<const_slang::ast::InstanceSymbol_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppIVar10 = (pointer)local_148._0_8_;
      if ((pCVar20->virtualInterfaceInstances).
          super__Vector_base<const_slang::ast::InstanceSymbol_*,_std::allocator<const_slang::ast::InstanceSymbol_*>_>
          ._M_impl.super__Vector_impl_data._M_finish != ppIVar24) {
        (pCVar20->virtualInterfaceInstances).
        super__Vector_base<const_slang::ast::InstanceSymbol_*,_std::allocator<const_slang::ast::InstanceSymbol_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = ppIVar24;
      }
      for (; ppIVar10 != (pointer)uVar11; ppIVar10 = ppIVar10 + 1) {
        instance = *ppIVar10;
        Symbol::visit<slang::ast::DiagnosticVisitor&>((Symbol *)instance,this);
        Compilation::checkVirtualIfaceInstance(this->compilation,instance);
      }
      if ((pointer)local_148._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_148._0_8_,(long)local_138 - local_148._0_8_);
      }
      pCVar20 = this->compilation;
    } while ((pCVar20->virtualInterfaceInstances).
             super__Vector_base<const_slang::ast::InstanceSymbol_*,_std::allocator<const_slang::ast::InstanceSymbol_*>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             (pCVar20->virtualInterfaceInstances).
             super__Vector_base<const_slang::ast::InstanceSymbol_*,_std::allocator<const_slang::ast::InstanceSymbol_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_108 = (Storage *)local_148;
  local_f8._0_8_ = 0x3f;
  local_f8._8_8_ = 1;
  stack0xffffffffffffff18 = ZEXT816(0x4a92e0);
  local_d8 = (undefined1  [16])0x0;
  local_b0.storage = (Storage *)local_98;
  local_a0 = 5;
  local_100 = local_108;
  do {
    local_a8 = 0;
    sVar5 = (this->genericClasses).super_SmallVectorBase<const_slang::ast::GenericClassDefSymbol_*>.
            len;
    if (sVar5 == 0) goto LAB_002eae37;
    ppGVar23 = (this->genericClasses).
               super_SmallVectorBase<const_slang::ast::GenericClassDefSymbol_*>.data_;
    local_150 = ppGVar23 + sVar5;
    bVar13 = false;
    do {
      local_a8 = 0;
      local_40._M_base._M_r = &(*ppGVar23)->specMap;
      local_c8._M_current =
           boost::unordered::detail::foa::
           table<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
           ::begin(&(local_40._M_base._M_r)->table_);
      local_c8._M_parent = &local_40;
      while (SVar12.storage = local_b0.storage, local_c8._M_current.p_ != (table_element_pointer)0x0
            ) {
        pTVar14 = (local_c8._M_current.p_)->second;
        auVar8._8_8_ = 0;
        auVar8._0_8_ = pTVar14;
        hash = SUB168(auVar8 * ZEXT816(0x9e3779b97f4a7c15),8) ^
               SUB168(auVar8 * ZEXT816(0x9e3779b97f4a7c15),0);
        pos0 = hash >> (local_f8[0] & 0x3f);
        uVar2 = (&boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)
                  ::word)[hash & 0xff];
        uVar22 = 0;
        uVar21 = pos0;
        do {
          pgVar1 = (group_type_pointer)(local_f8._16_8_ + uVar21 * 0x10);
          local_58 = pgVar1->m[0].n;
          uStack_57 = pgVar1->m[1].n;
          uStack_56 = pgVar1->m[2].n;
          bStack_55 = pgVar1->m[3].n;
          uStack_54 = pgVar1->m[4].n;
          uStack_53 = pgVar1->m[5].n;
          uStack_52 = pgVar1->m[6].n;
          bStack_51 = pgVar1->m[7].n;
          uStack_50 = pgVar1->m[8].n;
          uStack_4f = pgVar1->m[9].n;
          uStack_4e = pgVar1->m[10].n;
          bStack_4d = pgVar1->m[0xb].n;
          uStack_4c = pgVar1->m[0xc].n;
          uStack_4b = pgVar1->m[0xd].n;
          uStack_4a = pgVar1->m[0xe].n;
          bStack_49 = pgVar1->m[0xf].n;
          uVar27 = (uchar)uVar2;
          auVar33[0] = -(local_58 == uVar27);
          uVar30 = (uchar)((uint)uVar2 >> 8);
          auVar33[1] = -(uStack_57 == uVar30);
          uVar31 = (uchar)((uint)uVar2 >> 0x10);
          auVar33[2] = -(uStack_56 == uVar31);
          bVar32 = (byte)((uint)uVar2 >> 0x18);
          auVar33[3] = -(bStack_55 == bVar32);
          auVar33[4] = -(uStack_54 == uVar27);
          auVar33[5] = -(uStack_53 == uVar30);
          auVar33[6] = -(uStack_52 == uVar31);
          auVar33[7] = -(bStack_51 == bVar32);
          auVar33[8] = -(uStack_50 == uVar27);
          auVar33[9] = -(uStack_4f == uVar30);
          auVar33[10] = -(uStack_4e == uVar31);
          auVar33[0xb] = -(bStack_4d == bVar32);
          auVar33[0xc] = -(uStack_4c == uVar27);
          auVar33[0xd] = -(uStack_4b == uVar30);
          auVar33[0xe] = -(uStack_4a == uVar31);
          auVar33[0xf] = -(bStack_49 == bVar32);
          for (uVar18 = (uint)(ushort)((ushort)(SUB161(auVar33 >> 7,0) & 1) |
                                       (ushort)(SUB161(auVar33 >> 0xf,0) & 1) << 1 |
                                       (ushort)(SUB161(auVar33 >> 0x17,0) & 1) << 2 |
                                       (ushort)(SUB161(auVar33 >> 0x1f,0) & 1) << 3 |
                                       (ushort)(SUB161(auVar33 >> 0x27,0) & 1) << 4 |
                                       (ushort)(SUB161(auVar33 >> 0x2f,0) & 1) << 5 |
                                       (ushort)(SUB161(auVar33 >> 0x37,0) & 1) << 6 |
                                       (ushort)(SUB161(auVar33 >> 0x3f,0) & 1) << 7 |
                                       (ushort)(SUB161(auVar33 >> 0x47,0) & 1) << 8 |
                                       (ushort)(SUB161(auVar33 >> 0x4f,0) & 1) << 9 |
                                       (ushort)(SUB161(auVar33 >> 0x57,0) & 1) << 10 |
                                       (ushort)(SUB161(auVar33 >> 0x5f,0) & 1) << 0xb |
                                       (ushort)(SUB161(auVar33 >> 0x67,0) & 1) << 0xc |
                                       (ushort)(SUB161(auVar33 >> 0x6f,0) & 1) << 0xd |
                                      (ushort)(SUB161(auVar33 >> 0x77,0) & 1) << 0xe);
              local_158 = pTVar14, uVar18 != 0; uVar18 = uVar18 - 1 & uVar18) {
            uVar7 = 0;
            if (uVar18 != 0) {
              for (; (uVar18 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
              }
            }
            if (pTVar14 == ppTStack_e0[uVar21 * 0xf + (ulong)uVar7]) goto LAB_002ead62;
          }
          if (((&boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::
                 is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7] & bStack_49) == 0) break;
          lVar19 = uVar21 + uVar22;
          uVar22 = uVar22 + 1;
          uVar21 = lVar19 + 1U & local_f8._8_8_;
        } while (uVar22 <= (ulong)local_f8._8_8_);
        if ((ulong)local_d8._8_8_ < (ulong)local_d8._0_8_) {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Type_const*,void>,std::equal_to<slang::ast::Type_const*>,slang::detail::hashing::StackAllocator<slang::ast::Type_const*,64ul,16ul>>
          ::nosize_unchecked_emplace_at<slang::ast::Type_const*>
                    (&local_70,
                     (table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Type_const*,void>,std::equal_to<slang::ast::Type_const*>,slang::detail::hashing::StackAllocator<slang::ast::Type_const*,64ul,16ul>>
                      *)&local_100,(arrays_type *)local_f8,pos0,hash,&local_158);
          local_d8._8_8_ = local_d8._8_8_ + 1;
        }
        else {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Type_const*,void>,std::equal_to<slang::ast::Type_const*>,slang::detail::hashing::StackAllocator<slang::ast::Type_const*,64ul,16ul>>
          ::unchecked_emplace_with_rehash<slang::ast::Type_const*>
                    (&local_70,
                     (table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Type_const*,void>,std::equal_to<slang::ast::Type_const*>,slang::detail::hashing::StackAllocator<slang::ast::Type_const*,64ul,16ul>>
                      *)&local_100,hash,&local_158);
        }
        local_70.pg = (group15<boost::unordered::detail::foa::plain_integral> *)pTVar14;
        SmallVectorBase<slang::ast::Type_const*>::emplace_back<slang::ast::Type_const*>
                  ((SmallVectorBase<slang::ast::Type_const*> *)&local_b0,(Type **)&local_70);
LAB_002ead62:
        std::ranges::
        transform_view<std::ranges::ref_view<boost::unordered::unordered_flat_map<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/../include/slang/ast/symbols/ClassSymbols.h:223:47)>
        ::_Iterator<false>::operator++(&local_c8);
      }
      if (local_a8 != 0) {
        lVar26 = local_a8 << 3;
        lVar19 = 0;
        do {
          Symbol::visit<slang::ast::DiagnosticVisitor&>
                    (*(Symbol **)((SVar12.storage)->buffer + lVar19),this);
          lVar19 = lVar19 + 8;
        } while (lVar26 != lVar19);
        bVar13 = true;
      }
      local_a8 = 0;
      ppGVar23 = ppGVar23 + 1;
    } while (ppGVar23 != local_150);
  } while (bVar13);
  sVar5 = (this->genericClasses).super_SmallVectorBase<const_slang::ast::GenericClassDefSymbol_*>.
          len;
  if (sVar5 != 0) {
    ppGVar23 = (this->genericClasses).
               super_SmallVectorBase<const_slang::ast::GenericClassDefSymbol_*>.data_;
    lVar19 = 0;
    do {
      this_01 = *(GenericClassDefSymbol **)((long)ppGVar23 + lVar19);
      if ((this_01->specMap).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
          .size_ctrl.size == 0) {
        pTVar14 = GenericClassDefSymbol::getInvalidSpecialization(this_01);
        Symbol::visit<slang::ast::DiagnosticVisitor&>(&pTVar14->super_Symbol,this);
      }
      lVar19 = lVar19 + 8;
    } while (sVar5 << 3 != lVar19);
  }
LAB_002eae37:
  iVar34 = boost::unordered::detail::foa::
           table<boost::unordered::detail::foa::flat_map_types<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_slang::hash<const_void_*,_void>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>_>_>
           ::begin(&(this->compilation->attributeMap).table_);
  if (iVar34.p_ != (table_element_pointer)0x0) {
LAB_002eae58:
    do {
      sVar3 = ((iVar34.p_)->second)._M_extent._M_extent_value;
      if (sVar3 != 0) {
        ppAVar6 = ((iVar34.p_)->second)._M_ptr;
        lVar19 = 0;
        do {
          AttributeSymbol::getValue(*(AttributeSymbol **)((long)ppAVar6 + lVar19));
          lVar19 = lVar19 + 8;
        } while (sVar3 << 3 != lVar19);
      }
      puVar16 = iVar34.pc_ + 0x12;
      puVar25 = iVar34.pc_ + 2;
      while( true ) {
        puVar15 = puVar25;
        puVar25 = iVar34.pc_;
        ppVar17 = iVar34.p_ + 1;
        if (((uint)iVar34.pc_ & 0xf) == 0xe) break;
        iVar34.p_ = ppVar17;
        iVar34.pc_ = puVar25 + 1;
        puVar16 = puVar16 + 1;
        puVar25 = puVar15 + 1;
        if (puVar15[-1] != '\0') goto code_r0x002eaead;
      }
      auVar28[0] = -(*puVar15 == '\0');
      auVar28[1] = -(puVar15[1] == '\0');
      auVar28[2] = -(puVar15[2] == '\0');
      auVar28[3] = -(puVar15[3] == '\0');
      auVar28[4] = -(puVar15[4] == '\0');
      auVar28[5] = -(puVar15[5] == '\0');
      auVar28[6] = -(puVar15[6] == '\0');
      auVar28[7] = -(puVar15[7] == '\0');
      auVar28[8] = -(puVar15[8] == '\0');
      auVar28[9] = -(puVar15[9] == '\0');
      auVar28[10] = -(puVar15[10] == '\0');
      auVar28[0xb] = -(puVar15[0xb] == '\0');
      auVar28[0xc] = -(puVar15[0xc] == '\0');
      auVar28[0xd] = -(puVar15[0xd] == '\0');
      auVar28[0xe] = -(puVar15[0xe] == '\0');
      auVar28[0xf] = -(puVar15[0xf] == '\0');
      uVar9 = (ushort)(SUB161(auVar28 >> 7,0) & 1) | (ushort)(SUB161(auVar28 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar28 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar28 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar28 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar28 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar28 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar28 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar28 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar28 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar28 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar28 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar28 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar28 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar28 >> 0x77,0) & 1) << 0xe;
      while (uVar9 == 0x7fff) {
        ppVar17 = ppVar17 + 0xf;
        auVar29[0] = -(*puVar16 == '\0');
        auVar29[1] = -(puVar16[1] == '\0');
        auVar29[2] = -(puVar16[2] == '\0');
        auVar29[3] = -(puVar16[3] == '\0');
        auVar29[4] = -(puVar16[4] == '\0');
        auVar29[5] = -(puVar16[5] == '\0');
        auVar29[6] = -(puVar16[6] == '\0');
        auVar29[7] = -(puVar16[7] == '\0');
        auVar29[8] = -(puVar16[8] == '\0');
        auVar29[9] = -(puVar16[9] == '\0');
        auVar29[10] = -(puVar16[10] == '\0');
        auVar29[0xb] = -(puVar16[0xb] == '\0');
        auVar29[0xc] = -(puVar16[0xc] == '\0');
        auVar29[0xd] = -(puVar16[0xd] == '\0');
        auVar29[0xe] = -(puVar16[0xe] == '\0');
        auVar29[0xf] = -(puVar16[0xf] == '\0');
        puVar15 = puVar16;
        puVar16 = puVar16 + 0x10;
        uVar9 = (ushort)(SUB161(auVar29 >> 7,0) & 1) | (ushort)(SUB161(auVar29 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar29 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar29 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar29 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar29 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar29 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar29 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar29 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar29 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar29 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar29 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar29 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar29 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar29 >> 0x77,0) & 1) << 0xe;
      }
      uVar18 = 0;
      if ((uVar9 ^ 0x7fff) != 0) {
        for (; ((uVar9 ^ 0x7fff) >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
        }
      }
      if (puVar15[uVar18] == '\x01') break;
      iVar34.p_ = ppVar17 + uVar18;
      iVar34.pc_ = puVar15 + uVar18;
    } while( true );
  }
LAB_002eaf16:
  if (local_b0.storage != (Storage *)local_98) {
    operator_delete(local_b0.storage);
  }
  local_b0.storage = local_100;
  if (ppTStack_e0 != (Type **)0x0) {
    slang::detail::hashing::StackAllocator<const_slang::ast::Type_*,_64UL,_16UL>::deallocate
              (&local_b0,ppTStack_e0,local_f8._8_8_ * 0x88 + 0x96U >> 3);
  }
  return;
code_r0x002eaead:
  if (puVar15[-1] != '\x01') {
    iVar34.pc_ = puVar15 + -1;
    goto LAB_002eae58;
  }
  goto LAB_002eaf16;
}

Assistant:

void finalize() {
        // Once everything has been visited, go back over and check things that might
        // have been influenced by visiting later symbols.

        // For all hierarchical assignments, make sure we actually visited their
        // target instances and didn't skip them due to caching.
        if (!compilation.hierarchicalAssignments.empty()) {
            disableCache = true;
            auto hierarchicalAssignments = compilation.hierarchicalAssignments;
            for (auto hierRef : hierarchicalAssignments) {
                // Walk the path and visit all instances we find that were previously cached.
                for (auto& [sym, _] : hierRef->path) {
                    if (sym->kind == SymbolKind::Instance) {
                        auto& inst = sym->as<InstanceSymbol>();
                        if (inst.getCanonicalBody() != nullptr)
                            inst.visit(*this);
                    }
                }
            }
        }

        // Check the validity of virtual interface assignments.
        while (!compilation.virtualInterfaceInstances.empty()) {
            auto vii = compilation.virtualInterfaceInstances;
            compilation.virtualInterfaceInstances.clear();

            for (auto inst : vii) {
                inst->visit(*this);
                compilation.checkVirtualIfaceInstance(*inst);
            }
        }

        // Visiting a specialization can trigger more specializations to be made for the
        // same or other generic classes, so we need to be careful here when iterating.
        SmallSet<const Type*, 8> visitedSpecs;
        SmallVector<const Type*> toVisit;
        bool didSomething;
        do {
            didSomething = false;
            for (auto symbol : genericClasses) {
                for (auto& spec : symbol->specializations()) {
                    if (visitedSpecs.emplace(&spec).second)
                        toVisit.push_back(&spec);
                }

                for (auto spec : toVisit) {
                    spec->visit(*this);
                    didSomething = true;
                }

                toVisit.clear();
            }
        } while (didSomething);

        // Go back over and find generic classes that were never instantiated
        // and force an empty one to make sure we collect all diagnostics that
        // don't depend on parameter values.
        for (auto symbol : genericClasses) {
            if (symbol->numSpecializations() == 0)
                symbol->getInvalidSpecialization().visit(*this);
        }

        // Visit all attributes and force their values to resolve.
        for (auto& [_, attrList] : compilation.attributeMap) {
            for (auto attr : attrList)
                attr->getValue();
        }
    }